

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseGlobalType(WastParser *this,Global *global)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result RVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d5;
  allocator local_d4;
  allocator local_d3;
  allocator local_d2;
  allocator local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string asStack_b0 [32];
  string asStack_90 [32];
  string asStack_70 [32];
  iterator local_50;
  size_type local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  Enum local_28;
  Enum local_24;
  Global *local_20;
  Global *global_local;
  WastParser *this_local;
  
  local_20 = global;
  global_local = (Global *)this;
  bVar1 = MatchLpar(this,Mut);
  if (bVar1) {
    local_20->mutable_ = true;
    local_24 = (Enum)ParseValueType(this,&local_20->type);
    bVar1 = Failed((Result)local_24);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_d0,"i32",&local_d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_b0,"i64",&local_d2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_90,"f32",&local_d3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(asStack_70,"f64",&local_d4);
    local_50 = &local_d0;
    local_48 = 4;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_d5);
    __l._M_len = local_48;
    __l._M_array = local_50;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_40,__l,&local_d5);
    local_28 = (Enum)ErrorIfLpar(this,&local_40,(char *)0x0);
    bVar1 = Failed((Result)local_28);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_40);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_d5);
    local_f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50;
    do {
      local_f0 = local_f0 + -1;
      std::__cxx11::string::~string((string *)local_f0);
    } while (local_f0 != &local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d4);
    std::allocator<char>::~allocator((allocator<char> *)&local_d3);
    std::allocator<char>::~allocator((allocator<char> *)&local_d2);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    RVar2 = Expect(this,Rpar);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  else {
    RVar2 = ParseValueType(this,&local_20->type);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseGlobalType(Global* global) {
  WABT_TRACE(ParseGlobalType);
  if (MatchLpar(TokenType::Mut)) {
    global->mutable_ = true;
    CHECK_RESULT(ParseValueType(&global->type));
    CHECK_RESULT(ErrorIfLpar({"i32", "i64", "f32", "f64"}));
    EXPECT(Rpar);
  } else {
    CHECK_RESULT(ParseValueType(&global->type));
  }

  return Result::Ok;
}